

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParserTest.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::MakefileDepsParserTest_basic_Test::TestBody()::Testactions::error(llvm::
StringRef_unsigned_long_(void *this,StringRef message,uint64_t position)

{
  uint64_t local_50;
  StringRef local_48;
  string local_38;
  
  local_48.Length = message.Length;
  local_48.Data = message.Data;
  local_50 = position;
  llvm::StringRef::str_abi_cxx11_(&local_38,&local_48);
  std::
  vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
  ::emplace_back<std::__cxx11::string,unsigned_long&>
            ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
              *)((long)this + 0x20),&local_38,&local_50);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      errors.emplace_back(message.str(), position);
    }